

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_sem_init(uv_sem_t *sem,uint value)

{
  int iVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  int *piVar3;
  
  iVar1 = pthread_once(&glibc_version_check_once,glibc_version_check);
  if (iVar1 == 0) {
    if (platform_needs_custom_semaphore == 0) {
      iVar1 = 0;
      iVar2 = sem_init((sem_t *)sem,0,value);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        iVar1 = -*piVar3;
      }
    }
    else {
      __mutex = (pthread_mutex_t *)uv__malloc(0x60);
      if (__mutex == (pthread_mutex_t *)0x0) {
        iVar1 = -0xc;
      }
      else {
        iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
        if (iVar1 == 0) {
          iVar1 = uv_cond_init((uv_cond_t *)(__mutex + 1));
          if (iVar1 == 0) {
            *(uint *)((long)__mutex + 0x58) = value;
            *(pthread_mutex_t **)sem = __mutex;
            return 0;
          }
          iVar2 = pthread_mutex_destroy(__mutex);
          if (iVar2 != 0) goto LAB_0073d24c;
        }
        else {
          iVar1 = -iVar1;
        }
        uv__free(__mutex);
      }
    }
    return iVar1;
  }
LAB_0073d24c:
  abort();
}

Assistant:

int uv_sem_init(uv_sem_t* sem, unsigned int value) {
#if defined(__GLIBC__) && !defined(__UCLIBC__)
  uv_once(&glibc_version_check_once, glibc_version_check);
#endif

  if (platform_needs_custom_semaphore)
    return uv__custom_sem_init(sem, value);
  else
    return uv__sem_init(sem, value);
}